

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_symbolMacroValueBinding_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t name,
          sysbvm_tuple_t expansion)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_symbolMacroValueBinding_t *result;
  sysbvm_tuple_t expansion_local;
  sysbvm_tuple_t name_local;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).symbolMacroValueBindingType,6);
  (psVar1->field_1).pointers[0] = name;
  psVar1[1].field_1.pointers[0] = sourcePosition;
  sVar2 = sysbvm_tuple_getType(context,expansion);
  psVar1[2].header.field_0.typePointer = sVar2;
  psVar1[2].header.identityHashAndFlags = (int)expansion;
  psVar1[2].header.objectSize = (int)(expansion >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolMacroValueBinding_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t expansion)
{
    sysbvm_symbolMacroValueBinding_t *result = (sysbvm_symbolMacroValueBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolMacroValueBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolMacroValueBinding_t));
    result->super.super.name = name;
    result->super.sourcePosition = sourcePosition;
    result->super.type = sysbvm_tuple_getType(context, expansion);
    result->expansion = expansion;
    return (sysbvm_tuple_t)result;
}